

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeRefEq(TranslateToFuzzReader *this,Type type)

{
  Type TVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  
  if (type.id != 2) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x129c,"Expression *wasm::TranslateToFuzzReader::makeRefEq(Type)");
  }
  if ((~(this->wasm->features).features & 0x500) == 0) {
    TVar1 = getEqReferenceType(this);
    pEVar2 = make(this,TVar1);
    TVar1 = getEqReferenceType(this);
    pEVar3 = make(this,TVar1);
    pEVar4 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
    pEVar4->_id = RefEqId;
    (pEVar4->type).id = 0;
    *(Expression **)(pEVar4 + 1) = pEVar2;
    pEVar4[1].type.id = (uintptr_t)pEVar3;
    wasm::RefEq::finalize();
    return pEVar4;
  }
  __assert_fail("wasm.features.hasReferenceTypes() && wasm.features.hasGC()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x129d,"Expression *wasm::TranslateToFuzzReader::makeRefEq(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeRefEq(Type type) {
  assert(type == Type::i32);
  assert(wasm.features.hasReferenceTypes() && wasm.features.hasGC());
  auto* left = make(getEqReferenceType());
  auto* right = make(getEqReferenceType());
  return builder.makeRefEq(left, right);
}